

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_0::NegativePartialUpdateTest::init
          (NegativePartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  NativeDisplay *pNVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  Library *egl;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  NativeWindowFactory *pNVar7;
  undefined4 extraout_var_00;
  EGLSurface pvVar8;
  undefined4 extraout_var_01;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar9;
  EGLint pbufferAttribList [5];
  string local_58;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar5;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EGL_KHR_partial_update","");
  bVar2 = eglu::hasExtension(egl,pvVar5,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             local_58.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (bVar2) {
    pvVar6 = getEGLConfig(egl,this->m_eglDisplay,this->m_surfaceType,this->m_preserveBuffer);
    this->m_eglConfig = pvVar6;
    if (this->m_surfaceType == SURFACETYPE_PBUFFER) {
      local_58._M_dataplus._M_p = (pointer)0x1e000003057;
      local_58._M_string_length._0_4_ = 0x3056;
      local_58._M_string_length._4_4_ = 0x1e0;
      local_58.field_2._M_allocated_capacity._0_4_ = 0x3038;
      iVar3 = (*egl->_vptr_Library[10])(egl,this->m_eglDisplay,pvVar6);
      pvVar8 = (EGLSurface)CONCAT44(extraout_var,iVar3);
    }
    else {
      pNVar7 = eglu::selectNativeWindowFactory
                         (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_cmdLine);
      pvVar5 = this->m_eglDisplay;
      pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      pvVar6 = this->m_eglConfig;
      local_58._M_string_length._0_4_ =
           eglu::parseWindowVisibility
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
      local_58._M_dataplus._M_p = (pointer)0x1e0000001e0;
      iVar3 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                        (pNVar7,pNVar1,pvVar5,pvVar6);
      this->m_window = (NativeWindow *)CONCAT44(extraout_var_00,iVar3);
      pvVar8 = eglu::createWindowSurface
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_00,iVar3),
                          this->m_eglDisplay,this->m_eglConfig,(EGLAttrib *)0x0);
    }
    this->m_eglSurface = pvVar8;
    pvVar5 = this->m_eglDisplay;
    pvVar6 = this->m_eglConfig;
    (**egl->_vptr_Library)(egl,0x30a0);
    iVar3 = (*egl->_vptr_Library[6])(egl,pvVar5,pvVar6,0,init::contextAttribList);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar4,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x7c);
    if (pvVar8 != (EGLSurface)0x0) {
      (*egl->_vptr_Library[0x27])
                (egl,pvVar5,pvVar8,pvVar8,(EGLContext)CONCAT44(extraout_var_01,iVar3));
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0x7f);
      this->m_eglContext = (EGLContext)CONCAT44(extraout_var_01,iVar3);
      return extraout_EAX;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
               ,0x7d);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"EGL_KHR_partial_update is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
               ,0x9e);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

void NegativePartialUpdateTest::init (void)
{
	const Library&		egl						= m_eglTestCtx.getLibrary();
	static const EGLint	contextAttribList[]		= { EGL_CONTEXT_CLIENT_VERSION, 2,	EGL_NONE };
	const int			width					= 480;
	const int			height					= 480;

	m_eglDisplay = getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_eglConfig = getEGLConfig(egl, m_eglDisplay, m_surfaceType, m_preserveBuffer);

	if (m_surfaceType == SURFACETYPE_PBUFFER)
	{
		const EGLint pbufferAttribList[] = { EGL_WIDTH, width, EGL_HEIGHT, height, EGL_NONE };
		m_eglSurface = egl.createPbufferSurface(m_eglDisplay, m_eglConfig, pbufferAttribList);
	}
	else
	{
		const NativeWindowFactory&	factory	= selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
										WindowParams(width, height, parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);
	}
	m_eglContext = initAndMakeCurrentEGLContext(egl, m_eglDisplay, m_eglSurface, m_eglConfig, contextAttribList);
}